

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O0

void BuilderTests<flatbuffers::FlatBufferBuilderImpl<false>,_flatbuffers::FlatBufferBuilderImpl<false>_>
     ::nonempty_builder_movector_test(void)

{
  StringOffsetMap *expval;
  SizeT SVar1;
  size_t buffer_minalign;
  undefined1 local_120 [8];
  FlatBufferBuilderImpl<false> dst;
  size_t src_size;
  undefined1 local_88 [8];
  FlatBufferBuilderImpl<false> src;
  
  buffer_minalign = flatbuffers::AlignOf<unsigned_long>();
  flatbuffers::FlatBufferBuilderImpl<false>::FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<false> *)local_88,0x400,(Allocator *)0x0,false,buffer_minalign);
  populate1((FlatBufferBuilderImpl<false> *)local_88);
  SVar1 = flatbuffers::FlatBufferBuilderImpl<false>::GetSize
                    ((FlatBufferBuilderImpl<false> *)local_88);
  dst.string_pool = (StringOffsetMap *)(ulong)SVar1;
  flatbuffers::FlatBufferBuilderImpl<false>::FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<false> *)local_120,(FlatBufferBuilderImpl<false> *)local_88);
  expval = dst.string_pool;
  SVar1 = flatbuffers::FlatBufferBuilderImpl<false>::GetSize
                    ((FlatBufferBuilderImpl<false> *)local_120);
  TestEq<unsigned_long,unsigned_int>
            ((unsigned_long)expval,SVar1,"\'src_size\' != \'dst.GetSize()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test_builder.h"
             ,0x60,
             "static void BuilderTests<flatbuffers::FlatBufferBuilderImpl<>>::nonempty_builder_movector_test() [DestBuilder = flatbuffers::FlatBufferBuilderImpl<>, SrcBuilder = flatbuffers::FlatBufferBuilderImpl<>]"
            );
  SVar1 = flatbuffers::FlatBufferBuilderImpl<false>::GetSize
                    ((FlatBufferBuilderImpl<false> *)local_88);
  TestEq<unsigned_int,int>
            (SVar1,0,"\'src.GetSize()\' != \'0\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test_builder.h"
             ,0x61,
             "static void BuilderTests<flatbuffers::FlatBufferBuilderImpl<>>::nonempty_builder_movector_test() [DestBuilder = flatbuffers::FlatBufferBuilderImpl<>, SrcBuilder = flatbuffers::FlatBufferBuilderImpl<>]"
            );
  flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<false> *)local_120);
  flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<false> *)local_88);
  return;
}

Assistant:

static void nonempty_builder_movector_test() {
    SrcBuilder src;
    populate1(src);
    size_t src_size = src.GetSize();
    DestBuilder dst(std::move(src));
    TEST_EQ_FUNC(src_size, dst.GetSize());
    TEST_EQ_FUNC(src.GetSize(), 0);
  }